

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_find_xpath_atoms
                 (ly_ctx *ctx,lysc_node *ctx_node,char *xpath,uint32_t options,ly_set **set)

{
  lyd_node **pplVar1;
  ly_ctx *local_f8;
  uint local_e4;
  lyxp_expr *plStack_e0;
  uint32_t i;
  lyxp_expr *exp;
  lyxp_set xp_set;
  LY_ERR local_3c;
  LY_ERR ret;
  ly_set **set_local;
  uint32_t options_local;
  char *xpath_local;
  lysc_node *ctx_node_local;
  ly_ctx *ctx_local;
  
  memset(&exp,0,0x90);
  plStack_e0 = (lyxp_expr *)0x0;
  if ((ctx == (ly_ctx *)0x0) && (ctx_node == (lysc_node *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx || ctx_node",
           "lys_find_xpath_atoms");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (xpath == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","xpath",
           "lys_find_xpath_atoms");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (set == (ly_set **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","set",
           "lys_find_xpath_atoms");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    if (((ctx != (ly_ctx *)0x0) && (ctx_node != (lysc_node *)0x0)) &&
       (ctx_node->module->ctx != (ly_ctx *)0x0)) {
      if (ctx_node == (lysc_node *)0x0) {
        local_f8 = (ly_ctx *)0x0;
      }
      else {
        local_f8 = ctx_node->module->ctx;
      }
      if (ctx != local_f8) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
    }
    set_local._4_4_ = options;
    if ((options & 0x1c) == 0) {
      set_local._4_4_ = options | 4;
    }
    ctx_node_local = (lysc_node *)ctx;
    if (ctx == (ly_ctx *)0x0) {
      ctx_node_local = (lysc_node *)ctx_node->module->ctx;
    }
    local_3c = ly_set_new(set);
    if (((local_3c == LY_SUCCESS) &&
        (local_3c = lyxp_expr_parse((ly_ctx *)ctx_node_local,xpath,0,'\x01',&stack0xffffffffffffff20
                                   ), local_3c == LY_SUCCESS)) &&
       (local_3c = lyxp_atomize((ly_ctx *)ctx_node_local,plStack_e0,(lys_module *)0x0,LY_VALUE_JSON,
                                (void *)0x0,ctx_node,ctx_node,(lyxp_set *)&exp,set_local._4_4_),
       local_3c == LY_SUCCESS)) {
      pplVar1 = (lyd_node **)malloc((ulong)(uint)xp_set.val._8_4_ << 3);
      ((*set)->field_2).dnodes = pplVar1;
      if (((*set)->field_2).dnodes == (lyd_node **)0x0) {
        ly_log((ly_ctx *)ctx_node_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_find_xpath_atoms");
        local_3c = LY_EMEM;
      }
      else {
        (*set)->size = xp_set.val._8_4_;
        local_e4 = 0;
        while ((local_e4 < (uint)xp_set.val._8_4_ &&
               ((*(int *)(xp_set._8_8_ + (ulong)local_e4 * 0x18 + 8) != 3 ||
                (local_3c = ly_set_add(*set,*(void **)(xp_set._8_8_ + (ulong)local_e4 * 0x18),'\x01'
                                       ,(uint32_t *)0x0), local_3c == LY_SUCCESS))))) {
          local_e4 = local_e4 + 1;
        }
      }
    }
    lyxp_set_free_content((lyxp_set *)&exp);
    lyxp_expr_free((ly_ctx *)ctx_node_local,plStack_e0);
    ctx_local._4_4_ = local_3c;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_xpath_atoms(const struct ly_ctx *ctx, const struct lysc_node *ctx_node, const char *xpath, uint32_t options,
        struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_set xp_set = {0};
    struct lyxp_expr *exp = NULL;
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, ctx || ctx_node, xpath, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, ctx_node ? ctx_node->module->ctx : NULL, LY_EINVAL);
    if (!(options & LYXP_SCNODE_ALL)) {
        options |= LYXP_SCNODE;
    }
    if (!ctx) {
        ctx = ctx_node->module->ctx;
    }

    /* allocate return set */
    ret = ly_set_new(set);
    LY_CHECK_GOTO(ret, cleanup);

    /* compile expression */
    ret = lyxp_expr_parse(ctx, xpath, 0, 1, &exp);
    LY_CHECK_GOTO(ret, cleanup);

    /* atomize expression */
    ret = lyxp_atomize(ctx, exp, NULL, LY_VALUE_JSON, NULL, ctx_node, ctx_node, &xp_set, options);
    LY_CHECK_GOTO(ret, cleanup);

    /* transform into ly_set */
    (*set)->objs = malloc(xp_set.used * sizeof *(*set)->objs);
    LY_CHECK_ERR_GOTO(!(*set)->objs, LOGMEM(ctx); ret = LY_EMEM, cleanup);
    (*set)->size = xp_set.used;

    for (i = 0; i < xp_set.used; ++i) {
        if (xp_set.val.scnodes[i].type == LYXP_NODE_ELEM) {
            ret = ly_set_add(*set, xp_set.val.scnodes[i].scnode, 1, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyxp_set_free_content(&xp_set);
    lyxp_expr_free(ctx, exp);
    return ret;
}